

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O0

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusMenuItem> *list)

{
  long lVar1;
  byte bVar2;
  QDBusArgument *in_RDI;
  long in_FS_OFFSET;
  QDBusMenuItem item;
  QDBusMenuItem *in_stack_ffffffffffffffc8;
  QList<QDBusMenuItem> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QDBusMenuItem>::clear(in_stack_ffffffffffffffd0);
  while( true ) {
    bVar2 = QDBusArgument::atEnd();
    if (((bVar2 ^ 0xff) & 1) == 0) break;
    QDBusMenuItem::QDBusMenuItem((QDBusMenuItem *)0xb166b8);
    operator>>((QDBusArgument *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    QList<QDBusMenuItem>::push_back(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    QDBusMenuItem::~QDBusMenuItem((QDBusMenuItem *)0xb166e0);
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}